

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::InitializeDiskSourceTree
          (CommandLineInterface *this,DiskSourceTree *source_tree,
          DescriptorDatabase *fallback_database)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  byte bVar1;
  pointer pbVar2;
  bool bVar3;
  ssize_t sVar4;
  pointer ppVar5;
  AlphaNum *b;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar6;
  anon_unknown_5 *paVar7;
  anon_unknown_5 *this_01;
  CommandLineInterface *pCVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_file;
  long lVar9;
  pointer proto;
  ulong uVar10;
  string_view path;
  string_view path_00;
  string_view path_01;
  string_view virtual_path;
  string_view disk_path;
  string include_path;
  string path_str;
  char buffer [4096];
  string local_10d8;
  basic_string_view<char,_std::char_traits<char>_> local_10b8;
  CommandLineInterface *local_10a8;
  anon_unknown_5 *local_10a0;
  undefined1 local_1098 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1088;
  _Alloc_hider local_1078;
  undefined1 local_1068 [48];
  anon_unknown_5 *local_1038;
  HeapOrSoo local_1030 [256];
  
  local_10a0 = (anon_unknown_5 *)0x0;
  local_1098[0] = 0;
  local_10a8 = (CommandLineInterface *)local_1098;
  sVar4 = readlink("/proc/self/exe",(char *)&local_1038,0x1000);
  if (0 < (int)sVar4) {
    std::__cxx11::string::_M_replace((ulong)&local_10a8,0,(char *)local_10a0,(ulong)&local_1038);
    pCVar8 = local_10a8;
    local_10b8._M_str = (char *)local_10a8;
    if (local_10a0 != (anon_unknown_5 *)0x0) {
      this_00 = &this->proto_path_;
      paVar7 = local_10a0;
      do {
        bVar1 = (&local_10a8[-1].field_0x23f)[(long)paVar7];
        b = (AlphaNum *)(ulong)bVar1;
        if ((bVar1 == 0x2f) || (bVar1 == 0x5c)) {
          if ((anon_unknown_5 *)0x1 < paVar7) {
            this_01 = paVar7 + -1;
            if (local_10a0 < paVar7 + -1) {
              this_01 = local_10a0;
            }
            path._M_str = (char *)this_00;
            path._M_len = (size_t)local_10a8;
            local_10b8._M_len = (size_t)this_01;
            bVar3 = anon_unknown_5::IsInstalledProtoPath(this_01,path);
            if (!bVar3) {
              local_1030[0].heap.control = pCVar8;
              local_1068._0_8_ = 8;
              local_1068._8_8_ = "/include";
              local_1038 = this_01;
              absl::lts_20250127::StrCat_abi_cxx11_
                        (&local_10d8,(lts_20250127 *)&local_1038,(AlphaNum *)local_1068,b);
              path_00._M_str = extraout_RDX;
              path_00._M_len = (size_t)local_10d8._M_dataplus._M_p;
              bVar3 = anon_unknown_5::IsInstalledProtoPath
                                ((anon_unknown_5 *)local_10d8._M_string_length,path_00);
              paVar7 = this_01;
              if (bVar3) goto LAB_00d4f62a;
              goto LAB_00d4f643;
            }
            std::
            vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            ::emplace_back<char_const(&)[1],std::basic_string_view<char,std::char_traits<char>>&>
                      ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                        *)this_00,(char (*) [1])(anon_var_dwarf_a22956 + 5),&local_10b8);
          }
          break;
        }
        paVar7 = paVar7 + -1;
      } while (paVar7 != (anon_unknown_5 *)0x0);
    }
  }
  goto LAB_00d4f70d;
  while (paVar7 = paVar7 + -1, paVar7 != (anon_unknown_5 *)0x0) {
LAB_00d4f643:
    bVar1 = (&pCVar8[-1].field_0x23f)[(long)paVar7];
    if ((bVar1 == 0x2f) || (bVar1 == 0x5c)) {
      if ((anon_unknown_5 *)0x1 < paVar7) {
        local_10b8._M_len = (size_t)(paVar7 + -1);
        if (this_01 < paVar7 + -1) {
          local_10b8._M_len = (size_t)this_01;
        }
        local_1030[0].heap.control = pCVar8;
        local_1068._0_8_ = 8;
        local_1068._8_8_ = "/include";
        local_1038 = (anon_unknown_5 *)local_10b8._M_len;
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)(local_1098 + 0x10),(lts_20250127 *)&local_1038,(AlphaNum *)local_1068,
                   (AlphaNum *)(ulong)bVar1);
        std::__cxx11::string::operator=((string *)&local_10d8,(string *)(local_1098 + 0x10));
        pcVar6 = extraout_RDX_00;
        if ((undefined1 *)local_1088._M_allocated_capacity != local_1098 + 0x20) {
          operator_delete((void *)local_1088._M_allocated_capacity,(ulong)(local_1078._M_p + 1));
          pcVar6 = extraout_RDX_01;
        }
        path_01._M_str = pcVar6;
        path_01._M_len = (size_t)local_10d8._M_dataplus._M_p;
        bVar3 = anon_unknown_5::IsInstalledProtoPath
                          ((anon_unknown_5 *)local_10d8._M_string_length,path_01);
        if (bVar3) {
LAB_00d4f62a:
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<char_const(&)[1],std::__cxx11::string>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)this_00,(char (*) [1])(anon_var_dwarf_a22956 + 5),&local_10d8);
        }
      }
      break;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
    operator_delete(local_10d8._M_dataplus._M_p,local_10d8.field_2._M_allocated_capacity + 1);
  }
LAB_00d4f70d:
  pCVar8 = local_10a8;
  if (local_10a8 != (CommandLineInterface *)local_1098) {
    operator_delete(local_10a8,CONCAT71(local_1098._1_7_,local_1098[0]) + 1);
  }
  ppVar5 = (this->proto_path_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar5) {
    lVar9 = 0x28;
    uVar10 = 0;
    do {
      virtual_path._M_str = *(char **)((long)ppVar5 + lVar9 + -0x28);
      virtual_path._M_len = *(size_t *)((long)ppVar5 + lVar9 + -0x20);
      disk_path._M_str = *(char **)((long)ppVar5 + lVar9 + -8);
      disk_path._M_len = *(size_t *)((long)&(ppVar5->first)._M_dataplus._M_p + lVar9);
      pCVar8 = (CommandLineInterface *)source_tree;
      DiskSourceTree::MapPath(source_tree,virtual_path,disk_path);
      uVar10 = uVar10 + 1;
      ppVar5 = (this->proto_path_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x40;
    } while (uVar10 < (ulong)((long)(this->proto_path_).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >> 6))
    ;
  }
  proto = (this->input_files_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (proto == pbVar2) {
    bVar3 = true;
  }
  else {
    do {
      bVar3 = MakeProtoProtoPathRelative(pCVar8,source_tree,proto,fallback_database);
      if (!bVar3) {
        return bVar3;
      }
      proto = proto + 1;
    } while (proto != pbVar2);
  }
  return bVar3;
}

Assistant:

bool CommandLineInterface::InitializeDiskSourceTree(
    DiskSourceTree* source_tree, DescriptorDatabase* fallback_database) {
  AddDefaultProtoPaths(&proto_path_);

  // Set up the source tree.
  for (size_t i = 0; i < proto_path_.size(); ++i) {
    source_tree->MapPath(proto_path_[i].first, proto_path_[i].second);
  }

  // Map input files to virtual paths if possible.
  if (!MakeInputsBeProtoPathRelative(source_tree, fallback_database)) {
    return false;
  }

  return true;
}